

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

bool __thiscall RenX::Server::setUUIDIfDifferent(Server *this,PlayerInfo *player,string_view uuid)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  size_type __rlen;
  
  __n = uuid._M_len;
  if ((player->uuid)._M_string_length == __n) {
    if (__n != 0) {
      iVar2 = bcmp(uuid._M_str,(player->uuid)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_00134848;
    }
    bVar1 = false;
  }
  else {
LAB_00134848:
    setUUID(this,player,uuid);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool RenX::Server::setUUIDIfDifferent(RenX::PlayerInfo &player, std::string_view uuid) {
	if (player.uuid == uuid) {
		return false;
	}

	setUUID(player, uuid);
	return true;
}